

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O2

int enum_max(MetaContainer meta)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  MetaContainer *pMVar4;
  char *pcVar5;
  MetaIterator MVar6;
  MetaIterator MVar7;
  MetaIterator __begin1;
  MetaIterator local_40;
  MetaContainer local_30;
  
  pMVar4 = &local_30;
  MVar6 = rtosc::Port::MetaContainer::begin(pMVar4);
  local_40 = MVar6;
  MVar7 = rtosc::Port::MetaContainer::end(pMVar4);
  iVar1 = 0;
  pcVar5 = MVar6.title;
  while (pcVar5 != MVar7.title) {
    pcVar3 = strstr(pcVar5,"map ");
    if (pcVar3 != (char *)0x0) {
      iVar1 = atoi(pcVar5 + 4);
    }
    rtosc::Port::MetaIterator::operator++(&local_40);
    pcVar5 = local_40.title;
  }
  pMVar4 = &local_30;
  MVar6 = rtosc::Port::MetaContainer::begin(pMVar4);
  local_40 = MVar6;
  MVar7 = rtosc::Port::MetaContainer::end(pMVar4);
  pcVar5 = MVar6.title;
  while (pcVar5 != MVar7.title) {
    pcVar3 = strstr(pcVar5,"map ");
    if (pcVar3 != (char *)0x0) {
      iVar2 = atoi(pcVar5 + 4);
      if (iVar1 <= iVar2) {
        iVar1 = iVar2;
      }
    }
    rtosc::Port::MetaIterator::operator++(&local_40);
    pcVar5 = local_40.title;
  }
  return iVar1;
}

Assistant:

static int enum_max(Port::MetaContainer meta)
{
    int max = 0;
    for(auto m:meta)
        if(strstr(m.title, "map "))
            max = atoi(m.title+4);

    for(auto m:meta)
        if(strstr(m.title, "map "))
            max = max<atoi(m.title+4) ? atoi(m.title+4) : max;

    return max;
}